

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FtpServer.cpp
# Opt level: O3

void __thiscall gnl::FtpServer::removeFd(FtpServer *this,int closeFd)

{
  ssize_t sVar1;
  ostream *poVar2;
  _Base_ptr p_Var3;
  _Base_ptr p_Var4;
  _Base_ptr p_Var5;
  pair<std::_Rb_tree_iterator<std::pair<const_int,_gnl::FtpConsole_&>_>,_std::_Rb_tree_iterator<std::pair<const_int,_gnl::FtpConsole_&>_>_>
  pVar6;
  int revFd;
  char fd [16];
  int local_2c;
  char local_28 [24];
  
  local_28[0] = '\0';
  local_28[1] = '\0';
  local_28[2] = '\0';
  local_28[3] = '\0';
  local_28[4] = '\0';
  local_28[5] = '\0';
  local_28[6] = '\0';
  local_28[7] = '\0';
  local_28[8] = '\0';
  local_28[9] = '\0';
  local_28[10] = '\0';
  local_28[0xb] = '\0';
  local_28[0xc] = '\0';
  local_28[0xd] = '\0';
  local_28[0xe] = '\0';
  local_28[0xf] = '\0';
  sVar1 = read(closeFd,local_28,0x11);
  if ((int)sVar1 == -1) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"read colseFd error!",0x13);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x58);
    std::ostream::put(-0x58);
    std::ostream::flush();
    return;
  }
  if ((int)sVar1 == 0) {
    poVar2 = std::operator<<((ostream *)&std::cerr,"closeFd[1] has been closed !");
    std::endl<char,std::char_traits<char>>(poVar2);
    exit(-1);
  }
  local_2c = atoi(local_28);
  if (2 < local_2c) {
    p_Var4 = (this->mConnection)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    p_Var3 = &(this->mConnection)._M_t._M_impl.super__Rb_tree_header._M_header;
    p_Var5 = p_Var3;
    if (p_Var4 != (_Base_ptr)0x0) {
      do {
        if (local_2c <= (int)p_Var4[1]._M_color) {
          p_Var5 = p_Var4;
        }
        p_Var4 = (&p_Var4->_M_left)[(int)p_Var4[1]._M_color < local_2c];
      } while (p_Var4 != (_Base_ptr)0x0);
      if ((p_Var5 != p_Var3) && ((int)p_Var5[1]._M_color <= local_2c)) {
        p_Var3 = p_Var5;
      }
    }
    p_Var3 = p_Var3[1]._M_parent;
    if (p_Var3 != (_Base_ptr)0x0) {
      FtpConsole::~FtpConsole((FtpConsole *)p_Var3);
    }
    operator_delete(p_Var3);
    pVar6 = std::
            _Rb_tree<int,_std::pair<const_int,_gnl::FtpConsole_&>,_std::_Select1st<std::pair<const_int,_gnl::FtpConsole_&>_>,_std::less<int>,_std::allocator<std::pair<const_int,_gnl::FtpConsole_&>_>_>
            ::equal_range(&(this->mConnection)._M_t,&local_2c);
    std::
    _Rb_tree<int,_std::pair<const_int,_gnl::FtpConsole_&>,_std::_Select1st<std::pair<const_int,_gnl::FtpConsole_&>_>,_std::less<int>,_std::allocator<std::pair<const_int,_gnl::FtpConsole_&>_>_>
    ::_M_erase_aux(&(this->mConnection)._M_t,(_Base_ptr)pVar6.first._M_node,
                   (_Base_ptr)pVar6.second._M_node);
    close(local_2c);
  }
  return;
}

Assistant:

void FtpServer::removeFd(int closeFd){
        char fd[16] = {'\0'};
        int num = -1;
        if((num = read(closeFd, fd, sizeof(fd)+1)) == -1){
            std::cerr << "read colseFd error!" << std::endl;
            return;
        }else if(num == 0){
            std::cerr << "closeFd[1] has been closed !" << std::endl;
            exit(-1);
        }else{
            int revFd = atoi(fd);
            if(revFd > 2){
                delete (FtpConsole*)&mConnection.find(revFd)->second;
                //delete console;
                mConnection.erase(revFd);   //remove client socket from the mConnection
                close(revFd);   //close client socket
            }
        }
    }